

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O0

void __thiscall TApp_OptionFromDefaults_Test::TestBody(TApp_OptionFromDefaults_Test *this)

{
  bool bVar1;
  OptionBase<CLI::OptionDefaults> *pOVar2;
  Option *pOVar3;
  char *pcVar4;
  OptionDefaults *this_00;
  App *pAVar5;
  char *in_R9;
  string local_2f0;
  AssertHelper local_2d0;
  Message local_2c8;
  bool local_2b9;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_288;
  Message local_280;
  bool local_271;
  undefined1 local_270 [8];
  AssertionResult gtest_ar__3;
  string local_258;
  allocator local_231;
  string local_230;
  Option *local_210;
  Option *opt3;
  AssertHelper local_1e8;
  Message local_1e0;
  bool local_1d1;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar__2;
  string local_1b8;
  allocator local_191;
  string local_190;
  Option *local_170;
  Option *opt2;
  AssertHelper local_148;
  Message local_140;
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar__1;
  string local_118;
  allocator local_f1;
  string local_f0;
  Option *local_d0;
  Option *flag;
  AssertHelper local_a8;
  Message local_a0;
  bool local_91;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_;
  string local_78;
  allocator local_41;
  string local_40;
  Option *local_20;
  Option *opt;
  TApp_OptionFromDefaults_Test *pTStack_10;
  int x;
  TApp_OptionFromDefaults_Test *this_local;
  
  pAVar5 = &(this->super_TApp).app;
  pTStack_10 = this;
  pOVar2 = &CLI::App::option_defaults(pAVar5)->super_OptionBase<CLI::OptionDefaults>;
  CLI::OptionBase<CLI::OptionDefaults>::required(pOVar2,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"--simple",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_78,"",(allocator *)((long)&gtest_ar_.message_.ptr_ + 7));
  pOVar3 = CLI::App::add_option<int,_(CLI::detail::enabler)0>
                     (pAVar5,&local_40,(int *)((long)&opt + 4),&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_20 = pOVar3;
  local_91 = CLI::OptionBase<CLI::Option>::get_required(&pOVar3->super_OptionBase<CLI::Option>);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_90,&local_91,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&flag,(internal *)local_90,(AssertionResult *)"opt->get_required()","false"
               ,"true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x11c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&flag);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"--other",&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_118,"",(allocator *)((long)&gtest_ar__1.message_.ptr_ + 7));
  pOVar3 = CLI::App::add_flag(&(this->super_TApp).app,&local_f0,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar__1.message_.ptr_ + 7));
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  local_d0 = pOVar3;
  local_131 = CLI::OptionBase<CLI::Option>::get_required(&pOVar3->super_OptionBase<CLI::Option>);
  local_131 = !local_131;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_130,&local_131,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&opt2,(internal *)local_130,(AssertionResult *)"flag->get_required()",
               "true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x120,pcVar4);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    std::__cxx11::string::~string((string *)&opt2);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  pAVar5 = &(this->super_TApp).app;
  pOVar2 = &CLI::App::option_defaults(pAVar5)->super_OptionBase<CLI::OptionDefaults>;
  CLI::OptionBase<CLI::OptionDefaults>::required(pOVar2,false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_190,"--simple2",&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1b8,"",(allocator *)((long)&gtest_ar__2.message_.ptr_ + 7));
  pOVar3 = CLI::App::add_option<int,_(CLI::detail::enabler)0>
                     (pAVar5,&local_190,(int *)((long)&opt + 4),&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar__2.message_.ptr_ + 7));
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  local_170 = pOVar3;
  local_1d1 = CLI::OptionBase<CLI::Option>::get_required(&pOVar3->super_OptionBase<CLI::Option>);
  local_1d1 = !local_1d1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d0,&local_1d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&opt3,(internal *)local_1d0,(AssertionResult *)"opt2->get_required()",
               "true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x124,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    std::__cxx11::string::~string((string *)&opt3);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  pAVar5 = &(this->super_TApp).app;
  pOVar2 = &CLI::App::option_defaults(pAVar5)->super_OptionBase<CLI::OptionDefaults>;
  this_00 = CLI::OptionBase<CLI::OptionDefaults>::required(pOVar2,true);
  CLI::OptionDefaults::ignore_case(this_00,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_230,"--simple3",&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_258,"",(allocator *)((long)&gtest_ar__3.message_.ptr_ + 7));
  pOVar3 = CLI::App::add_option<int,_(CLI::detail::enabler)0>
                     (pAVar5,&local_230,(int *)((long)&opt + 4),&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar__3.message_.ptr_ + 7));
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  local_210 = pOVar3;
  local_271 = CLI::OptionBase<CLI::Option>::get_required(&pOVar3->super_OptionBase<CLI::Option>);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_270,&local_271,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_270,
               (AssertionResult *)"opt3->get_required()","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x129,pcVar4);
    testing::internal::AssertHelper::operator=(&local_288,&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  local_2b9 = CLI::OptionBase<CLI::Option>::get_ignore_case
                        (&local_210->super_OptionBase<CLI::Option>);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2b8,&local_2b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(&local_2c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2f0,(internal *)local_2b8,(AssertionResult *)"opt3->get_ignore_case()","false"
               ,"true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x12a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    std::__cxx11::string::~string((string *)&local_2f0);
    testing::Message::~Message(&local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  return;
}

Assistant:

TEST_F(TApp, OptionFromDefaults) {
    app.option_defaults()->required();

    // Options should remember defaults
    int x;
    auto opt = app.add_option("--simple", x);
    EXPECT_TRUE(opt->get_required());

    // Flags cannot be required
    auto flag = app.add_flag("--other");
    EXPECT_FALSE(flag->get_required());

    app.option_defaults()->required(false);
    auto opt2 = app.add_option("--simple2", x);
    EXPECT_FALSE(opt2->get_required());

    app.option_defaults()->required()->ignore_case();

    auto opt3 = app.add_option("--simple3", x);
    EXPECT_TRUE(opt3->get_required());
    EXPECT_TRUE(opt3->get_ignore_case());
}